

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLbitset.c
# Opt level: O2

uint RDL_bitset_compressed(uchar **compressed,char *edges,uint size)

{
  uint uVar1;
  ulong uVar2;
  
  uVar1 = RDL_bitset_init(compressed,size);
  for (uVar2 = 0; size != uVar2; uVar2 = uVar2 + 1) {
    if (edges[uVar2] != '\0') {
      (*compressed)[uVar2 >> 3 & 0x1fffffff] =
           (*compressed)[uVar2 >> 3 & 0x1fffffff] | '\x01' << ((byte)uVar2 & 7);
    }
  }
  return uVar1;
}

Assistant:

unsigned RDL_bitset_compressed(unsigned char** compressed, const char* edges, unsigned size)
{
  unsigned new_size, i;

  new_size = RDL_bitset_init(compressed, size);

  for (i = 0; i < size; ++i) {
    if (edges[i]) {
      RDL_bitset_set(*compressed, i);
    }
  }

  return new_size;
}